

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateSequence
          (Catalog *this,CatalogTransaction transaction,CreateSequenceInfo *info)

{
  int iVar1;
  undefined4 extraout_var;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  EntryLookupInfo schema_lookup;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_40;
  EntryLookupInfo local_38;
  undefined4 extraout_var_00;
  
  EntryLookupInfo::EntryLookupInfo
            (&local_38,SCHEMA_ENTRY,&(info->super_CreateInfo).schema,
             (QueryErrorContext)0xffffffffffffffff);
  iVar1 = (*this->_vptr_Catalog[8])(this,&local_38,0);
  local_40.ptr = (SchemaCatalogEntry *)CONCAT44(extraout_var,iVar1);
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_40);
  oVar2.ptr._0_4_ =
       (*((local_40.ptr)->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x16])
                 (local_40.ptr,info);
  oVar2.ptr._4_4_ = extraout_var_00;
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar2.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateSequence(CatalogTransaction transaction, CreateSequenceInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	return CreateSequence(transaction, schema, info);
}